

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry *
NscBuildStatement(CNscPStackEntry *pList,CNscPStackEntry *pStatement,CNscPStackEntry *pFence)

{
  bool bVar1;
  NscType NVar2;
  long in_RDX;
  CNscPStackEntry *in_RSI;
  CNscContext *in_RDI;
  NscSymbolFence *pFence_1;
  int nLocals;
  NscType nOutType;
  CNscPStackEntry *pOut;
  undefined4 in_stack_ffffffffffffffa8;
  NscType in_stack_ffffffffffffffac;
  CNscContext *in_stack_ffffffffffffffb0;
  NscType in_stack_ffffffffffffffb8;
  NscPCode in_stack_ffffffffffffffbc;
  CNscPStackEntry *in_stack_ffffffffffffffc0;
  CNscPStackEntry *in_stack_ffffffffffffffc8;
  NscSymbolFence *in_stack_ffffffffffffffd0;
  int nLocals_00;
  CNscContext *this;
  
  if (in_RDI == (CNscContext *)0x0) {
    in_RDI = (CNscContext *)
             CNscContext::GetPStackEntry
                       (in_stack_ffffffffffffffb0,
                        (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  }
  bVar1 = CNscContext::IsPhase2(g_pCtx);
  if ((((bVar1) || (bVar1 = CNscContext::IsNWScript(g_pCtx), bVar1)) &&
      (NVar2 = CNscPStackEntry::GetType((CNscPStackEntry *)in_RDI), NVar2 != NscType_Error)) &&
     (((in_RSI == (CNscPStackEntry *)0x0 ||
       (NVar2 = CNscPStackEntry::GetType(in_RSI), NVar2 != NscType_Error)) &&
      (nLocals_00 = 0, in_RSI != (CNscPStackEntry *)0x0)))) {
    if (in_RDX != 0) {
      in_stack_ffffffffffffffd0 = CNscContext::GetCurrentFence(g_pCtx);
    }
    NVar2 = CNscPStackEntry::GetType(in_RSI);
    if (NVar2 != NscType_Unknown) {
      in_stack_ffffffffffffffc8 = in_RSI;
      CNscPStackEntry::GetType(in_RSI);
      CNscPStackEntry::PushSimpleOp
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
    if (in_RDX == 0) {
      CNscPStackEntry::AppendData
                (in_stack_ffffffffffffffc0,
                 (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    else {
      this = in_RDI;
      CNscPStackEntry::GetData(in_RSI);
      CNscPStackEntry::GetDataSize(in_RSI);
      CNscPStackEntry::PushStatement
                ((CNscPStackEntry *)this,nLocals_00,(uchar *)in_stack_ffffffffffffffd0,
                 (size_t)in_stack_ffffffffffffffc8);
      in_stack_ffffffffffffffb0 = in_RDI;
      in_RDI = this;
    }
  }
  NVar2 = CNscPStackEntry::GetType((CNscPStackEntry *)in_RDI);
  if (NVar2 == NscType_Unknown) {
    CNscPStackEntry::SetType((CNscPStackEntry *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac)
    ;
  }
  if (in_RDX != 0) {
    CNscContext::RestoreFence
              (in_stack_ffffffffffffffb0,
               (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    CNscContext::FreePStackEntry
              (in_stack_ffffffffffffffb0,
               (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  if (in_RSI != (CNscPStackEntry *)0x0) {
    CNscContext::FreePStackEntry
              (in_stack_ffffffffffffffb0,
               (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  return (CNscPStackEntry *)in_RDI;
}

Assistant:

YYSTYPE NscBuildStatement (YYSTYPE pList, YYSTYPE pStatement, YYSTYPE pFence)
{

	//
	// If there isn't an list, then create
	//

	CNscPStackEntry *pOut = pList;
	if (pOut == NULL)
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);


	//
	// If this is phase1 and we are in a function, do nothing
	//

	NscType nOutType;
	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		nOutType = NscType_Unknown;
	}
	
	//
	// Check for errors
	//

	else if (pOut ->GetType () == NscType_Error ||
		(pStatement != NULL && pStatement ->GetType () == NscType_Error))
	{
		nOutType = NscType_Error;
	}

	//
	// Otherwise, we are good
	//

	else
	{

		//
		// Set the return type
		//

		nOutType = NscType_Unknown;

		//
		// If we have a statement 
		//

		if (pStatement != NULL)
		{

			//
			// Compute the size of the locals from the fence
			//

			int nLocals = 0;
			if (pFence)
			{
				NscSymbolFence *pFence = g_pCtx ->GetCurrentFence ();
				nLocals = pFence ->nLocals;
			}

			//
			// If the statement has a type, then add an end expression
			//

			if (pStatement ->GetType () != NscType_Unknown)
			{
				pStatement ->PushSimpleOp (NscPCode_ExpressionEnd, 
					pStatement ->GetType ());
			}

			//
			// If we have a fence, then push the whole block as a
			// statement.  Otherwise, just append as one more in
			// a series of statements.
			//

			if (pFence != NULL)
			{
				pOut ->PushStatement (
					nLocals,
					pStatement ->GetData (), 
					pStatement ->GetDataSize ());
			}

			//
			// Otherwise, we just do a simple append
			//

			else
			{
				pOut ->AppendData (pStatement);
			}
		}
	}

	//
	// Set the new type
	//

	if (pOut ->GetType () == NscType_Unknown)
		pOut ->SetType (nOutType);

	//
	// Process the fence
	//

	if (pFence != NULL)
	{
		g_pCtx ->RestoreFence (pFence);
		g_pCtx ->FreePStackEntry (pFence);
	}

	//
	// Return the new argument list
	//

	if (pStatement)
        g_pCtx ->FreePStackEntry (pStatement);
	return pOut;
}